

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printFPImmOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  _Bool _Var3;
  MCOperand *op;
  int64_t iVar4;
  float fVar5;
  double local_38;
  double FPImm;
  MCOperand *MO;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  _Var3 = MCOperand_isFPImm(op);
  if (_Var3) {
    local_38 = MCOperand_getFPImm(op);
  }
  else {
    iVar4 = MCOperand_getImm(op);
    fVar5 = AArch64_AM_getFPImmFloat((uint)iVar4);
    local_38 = (double)fVar5;
  }
  SStream_concat(O,"#%.8f",local_38);
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar1 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
    puVar1[0] = '\x04';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(double *)
     (MI->flat_insn->detail->groups +
     (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) = local_38;
    pcVar2 = MI->flat_insn->detail;
    (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
  }
  return;
}

Assistant:

static void printFPImmOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO = MCInst_getOperand(MI, OpNum);
	double FPImm = MCOperand_isFPImm(MO) ? MCOperand_getFPImm(MO) : AArch64_AM_getFPImmFloat((int)MCOperand_getImm(MO));

	// 8 decimal places are enough to perfectly represent permitted floats.
	SStream_concat(O, "#%.8f", FPImm);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_FP;
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].fp = FPImm;
		MI->flat_insn->detail->arm64.op_count++;
	}
}